

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

void __thiscall dg::DGLLVMPointerAnalysis::buildSubgraph(DGLLVMPointerAnalysis *this)

{
  PointerGraph *pPVar1;
  raw_ostream *this_00;
  
  pPVar1 = (PointerGraph *)dg::pta::LLVMPointerGraphBuilder::buildLLVMPointerGraph();
  this->PS = pPVar1;
  if (pPVar1 != (PointerGraph *)0x0) {
    return;
  }
  this_00 = (raw_ostream *)llvm::errs();
  llvm::raw_ostream::operator<<(this_00,"Pointer Subgraph was not built, aborting\n");
  abort();
}

Assistant:

void buildSubgraph() {
        // run the analysis itself
        assert(_builder && "Incorrectly constructed PTA, missing builder");

        PS = _builder->buildLLVMPointerGraph();
        if (!PS) {
            llvm::errs() << "Pointer Subgraph was not built, aborting\n";
            abort();
        }

        /*
        pta::PointerGraphOptimizer optimizer(PS);
        optimizer.run();

        if (optimizer.getNumOfRemovedNodes() > 0)
            _builder->composeMapping(std::move(optimizer.getMapping()));

        llvm::errs() << "PS optimization removed " <<
        optimizer.getNumOfRemovedNodes() << " nodes\n";
        */
    }